

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O1

void secp256k1_ge_set_infinity(secp256k1_ge *r)

{
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  *(undefined8 *)((long)(r->x).n + 0x1c) = 0;
  *(undefined8 *)((long)(r->x).n + 0x24) = 0;
  (r->x).normalized = 1;
  secp256k1_fe_verify(&r->x);
  *(undefined8 *)((long)(r->y).n + 0x1c) = 0;
  *(undefined8 *)((long)(r->y).n + 0x24) = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[0] = 0;
  (r->y).n[1] = 0;
  (r->y).normalized = 1;
  secp256k1_fe_verify(&r->y);
  secp256k1_ge_verify(r);
  return;
}

Assistant:

static void secp256k1_ge_set_infinity(secp256k1_ge *r) {
    r->infinity = 1;
    secp256k1_fe_set_int(&r->x, 0);
    secp256k1_fe_set_int(&r->y, 0);

    SECP256K1_GE_VERIFY(r);
}